

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O1

void __thiscall
tsbp::TwoStepBranchingProcedure::UpdateSolverStatistics
          (TwoStepBranchingProcedure *this,SolverStatistics *statistics)

{
  double dVar1;
  
  statistics->CallCountLMAO = statistics->CallCountLMAO + (this->statistics).CallCountLMAO;
  statistics->NodeCountLMAO = statistics->NodeCountLMAO + (this->statistics).NodeCountLMAO;
  statistics->TimeLMAO = (this->statistics).TimeLMAO + statistics->TimeLMAO;
  statistics->NodeCountTSBP = statistics->NodeCountTSBP + (this->statistics).NodeCountTSBP;
  statistics->TimeTSBP = (this->statistics).TimeTSBP + statistics->TimeTSBP;
  statistics->TimeMemoryDeallocation =
       (this->statistics).TimeMemoryDeallocation + statistics->TimeMemoryDeallocation;
  dVar1 = (this->statistics).MemoryUsage;
  if (dVar1 <= statistics->MemoryUsage) {
    dVar1 = statistics->MemoryUsage;
  }
  statistics->MemoryUsage = dVar1;
  return;
}

Assistant:

void TwoStepBranchingProcedure::UpdateSolverStatistics(SolverStatistics& statistics) const
{
    statistics.CallCountLMAO += this->statistics.CallCountLMAO;
    statistics.NodeCountLMAO += this->statistics.NodeCountLMAO;
    statistics.TimeLMAO += this->statistics.TimeLMAO;

    statistics.NodeCountTSBP += this->statistics.NodeCountTSBP;
    statistics.TimeTSBP += this->statistics.TimeTSBP;

    statistics.TimeMemoryDeallocation += this->statistics.TimeMemoryDeallocation;

    statistics.MemoryUsage = std::max<double>(statistics.MemoryUsage, this->statistics.MemoryUsage);
}